

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O2

fvar<double,_2UL> * __thiscall
ising::free_energy::square::
infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (fvar<double,_2UL> *__return_storage_ptr__,square *this,double Jx,double Jy,
          fvar<double,_2UL> beta)

{
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> f;
  invalid_argument *this_00;
  double *in_RCX;
  fvar<double,_2UL> *cr;
  fvar<double,_2UL> *cr_00;
  fvar<double,_2UL> *cr_01;
  fvar<double,_2UL> *cr_02;
  double *error;
  size_t *in_R8;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  fvar<double,_2UL> retval_9;
  root_type local_188;
  tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  integrator;
  root_type local_170;
  fvar<double,_2UL> retval_2;
  fvar<double,_2UL> retval_3;
  fvar<double,_2UL> retval;
  fvar<double,_2UL> retval_6;
  fvar<double,_2UL> retval_5;
  fvar<double,_2UL> retval_1;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> pStack_a8;
  double local_90;
  double dStack_88;
  double local_80;
  fvar<double,_2UL> retval_8;
  fvar<double,_2UL> retval_7;
  fvar_t local_40;
  root_type local_28;
  root_type local_20;
  
  if ((Jx <= 0.0) || (Jy <= 0.0)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Jx and Jy should be positive");
  }
  else {
    if (0.0 < beta.v._M_elems[0]) {
      retval_9.v._M_elems[0] = 8.900295434028806e-308;
      boost::math::quadrature::
      tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
      ::tanh_sinh(&integrator,0xf,(double *)&retval_9);
      local_188 = 2.0;
      local_1b8 = beta.v._M_elems[2];
      local_1c8 = beta.v._M_elems[0];
      dStack_1c0 = beta.v._M_elems[1];
      retval_7.v._M_elems[0] = 2.0;
      retval.v._M_elems[0] = beta.v._M_elems[0];
      retval.v._M_elems[1] = beta.v._M_elems[1];
      retval.v._M_elems[2] = beta.v._M_elems[2];
      local_1d8 = Jy;
      local_1d0 = Jx;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval,(root_type *)&retval_7);
      retval_1.v._M_elems[2] = retval.v._M_elems[2];
      retval_1.v._M_elems[0] = retval.v._M_elems[0];
      retval_1.v._M_elems[1] = retval.v._M_elems[1];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_1,&local_1d0);
      boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
                (&retval_9,(detail *)&retval_1,cr);
      retval_6.v._M_elems[0] = 2.0;
      retval_2.v._M_elems[0] = local_1c8;
      retval_2.v._M_elems[1] = dStack_1c0;
      retval_2.v._M_elems[2] = local_1b8;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_2,(root_type *)&retval_6);
      retval_3.v._M_elems[2] = retval_2.v._M_elems[2];
      retval_3.v._M_elems[0] = retval_2.v._M_elems[0];
      retval_3.v._M_elems[1] = retval_2.v._M_elems[1];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_3,&local_1d8);
      boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
                (&retval_5,(detail *)&retval_3,cr_00);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
                (&pStack_a8,(fvar<double,2ul> *)&retval_9,&retval_5);
      local_170 = 1.0;
      local_20 = 2.0;
      retval_3.v._M_elems[0] = local_1c8;
      retval_3.v._M_elems[1] = dStack_1c0;
      retval_3.v._M_elems[2] = local_1b8;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_3,&local_20);
      retval_5.v._M_elems[2] = retval_3.v._M_elems[2];
      retval_5.v._M_elems[0] = retval_3.v._M_elems[0];
      retval_5.v._M_elems[1] = retval_3.v._M_elems[1];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_5,&local_1d0);
      boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
                (&retval,(detail *)&retval_5,cr_01);
      local_28 = 2.0;
      retval_6.v._M_elems[0] = local_1c8;
      retval_6.v._M_elems[1] = dStack_1c0;
      retval_6.v._M_elems[2] = local_1b8;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_6,&local_28);
      retval_7.v._M_elems[2] = retval_6.v._M_elems[2];
      retval_7.v._M_elems[0] = retval_6.v._M_elems[0];
      retval_7.v._M_elems[1] = retval_6.v._M_elems[1];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_7,&local_1d8);
      boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
                (&retval_2,(detail *)&retval_7,cr_02);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
                (&retval_1,(fvar<double,2ul> *)&retval,&retval_2);
      boost::math::differentiation::autodiff_v1::detail::operator/(&retval_9,&local_170,&retval_1);
      local_80 = retval_9.v._M_elems[2];
      local_90 = retval_9.v._M_elems[0];
      dStack_88 = retval_9.v._M_elems[1];
      f.chab_.v._M_elems[0] = pStack_a8.v._M_elems[0];
      f.c_ = 0.15915494309189535;
      f.chab_.v._M_elems[1] = pStack_a8.v._M_elems[1];
      f.chab_.v._M_elems[2] = pStack_a8.v._M_elems[2];
      f.k_.v._M_elems[0] = retval_9.v._M_elems[0];
      f.k_.v._M_elems[1] = retval_9.v._M_elems[1];
      f.k_.v._M_elems[2] = retval_9.v._M_elems[2];
      boost::math::quadrature::
      tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
      ::
      integrate<ising::free_energy::square::(anonymous_namespace)::functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>_>
                (&local_40,&integrator,f,0.0,1.5707963267948966,1.4901161193847656e-08,error,in_RCX,
                 in_R8);
      retval_8.v._M_elems[2] = local_40.v._M_elems[2];
      retval_8.v._M_elems[0] = local_40.v._M_elems[0];
      retval_8.v._M_elems[1] = local_40.v._M_elems[1];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_8,&local_188);
      retval_9.v._M_elems[1] = retval_8.v._M_elems[1];
      retval_9.v._M_elems[2] = retval_8.v._M_elems[2];
      retval_9.v._M_elems[0] = retval_8.v._M_elems[0] + 0.34657359027997264;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::negate(&retval_9);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
                (__return_storage_ptr__,(fvar<double,2ul> *)&retval_9,&beta);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&integrator.m_imp.
                  super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return __return_storage_ptr__;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"beta should be positive");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline U infinite(T Jx, T Jy, U beta) {
  const unsigned long max_n = 1 << 16;
  typedef T real_t;
  if (Jx <= 0 || Jy <= 0)
    throw(std::invalid_argument("Jx and Jy should be positive"));
  if (beta <= 0)
    throw(std::invalid_argument("beta should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  boost::math::quadrature::tanh_sinh<real_t> integrator;
  auto logZ = log(real_t(2)) / 2 +
              2 * integrator.integrate(func(Jx, Jy, beta), 0, pi / 2);
  return -logZ / beta;
}